

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalForcesContIntDamping
          (ChElementShellANCF_3443 *this,ChVectorDynamic<> *Fi)

{
  ChKblockGeneric *pCVar1;
  double *pdVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  long lVar46;
  long lVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  ChVectorDynamic<> *pCVar54;
  void *pvVar55;
  undefined8 *puVar56;
  double *pdVar57;
  char *__function;
  ulong uVar58;
  ChElementShellANCF_3443 *pCVar59;
  long lVar60;
  pointer pLVar61;
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  VectorNIP E_BlockDamping;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  ChMatrixNM<double,_6,_6> D;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  Scalar local_3240;
  undefined1 *local_3238;
  double local_3230;
  undefined1 *local_3228;
  double local_3220;
  undefined1 *local_3218;
  double local_3210;
  undefined1 *local_3208;
  ChElementShellANCF_3443 *local_3200;
  long local_31f8;
  undefined1 local_31f0 [16];
  Matrix<double,__1,__1,_1,__1,__1> *local_31e0;
  variable_if_dynamic<long,__1> local_31d8;
  variable_if_dynamic<long,__1> local_31d0;
  long local_31c8;
  Matrix<double,_96,_3,_0,_96,_3> *local_31c0;
  long local_31b8;
  Matrix<double,__1,__1,_1,__1,__1> *local_31b0;
  ChVectorDynamic<> *local_31a8;
  long local_31a0;
  double local_3198;
  long local_3190;
  ulong local_3188;
  undefined1 local_3180 [64];
  undefined1 local_3140 [64];
  undefined1 local_3100 [64];
  undefined1 local_30c0 [64];
  undefined1 local_3080 [64];
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  undefined1 local_2fc0 [64];
  undefined1 local_2f80 [64];
  undefined1 local_2f40 [64];
  undefined1 local_2f00 [64];
  undefined1 local_2ec0 [64];
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a60 [96];
  pointer local_2a00;
  pointer local_29f8;
  pointer local_29f0;
  pointer local_29e8;
  pointer local_29e0;
  pointer local_29d8;
  pointer local_29d0;
  pointer local_29c8;
  pointer local_29c0;
  double local_29b8;
  double local_29b0;
  double local_29a8;
  double local_29a0;
  double local_2998;
  double local_2990;
  double local_2988;
  double local_2980;
  double local_2978;
  double local_2970;
  PointerType local_2968;
  Scalar local_2960;
  double local_2958;
  double local_2950;
  double local_2948;
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined1 local_28c0 [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  undefined1 local_25c0 [64];
  undefined1 local_2580 [64];
  undefined1 local_2540 [64];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [64];
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [64];
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [16];
  Matrix<double,__1,__1,_1,__1,__1> *pMStack_f30;
  undefined8 uStack_f28;
  long lStack_f20;
  long lStack_f18;
  Matrix<double,_16,_6,_1,_16,_6> *pMStack_f10;
  double dStack_f08;
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  Matrix<double,_16,_3,_1,_16,_3> local_500;
  MatrixNx6 local_380;
  
  local_31a8 = Fi;
  CalcCombinedCoordMatrix(this,&local_380);
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x28] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2a] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2b] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2c] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2d] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2e] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2f] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x23] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x24] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x25] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x27] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x15] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[8]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[9]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [10] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xd] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xf] = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[3]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[4]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[7]
       = 0.0;
  if (this->m_numLayers != 0) {
    local_31b0 = &this->m_SD;
    lVar60 = 0;
    uVar58 = 0;
    local_31f8 = 0;
    local_31b8 = 0x20;
    local_3200 = this;
    do {
      auVar62 = _local_f40;
      local_3188 = uVar58;
      if ((lVar60 < 0) ||
         ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x10)) {
LAB_0076b1d7:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 16, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 16, BlockCols = 96, InnerPanel = false]"
        ;
LAB_0076b203:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      lVar46 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      local_3190 = lVar60 + 0x60;
      if (lVar46 < local_3190) goto LAB_0076b1d7;
      local_f40._0_8_ =
           (long)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data + local_31f8;
      pMStack_f30 = local_31b0;
      uStack_f28 = 0;
      lStack_f20 = lVar60;
      lStack_f18 = lVar46;
      dStack_f08 = auVar62._56_8_;
      pMStack_f10 = &local_380;
      local_31a0 = lVar60;
      memset((Matrix<double,_96,_6,_0,_96,_6> *)local_2140,0,0x1200);
      pCVar59 = local_3200;
      local_2a60._0_8_ = (_func_int **)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>>,Eigen::Matrix<double,16,6,1,16,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,96,6,0,96,6>>
                ((Matrix<double,_96,_6,_0,_96,_6> *)local_2140,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>
                  *)local_f40,&local_380,(Scalar *)local_2a60);
      lVar60 = local_31b8;
      this = local_3200;
      auVar62 = vmulpd_avx512f(local_2140,local_1840);
      auVar63 = vmulpd_avx512f(local_1e40,local_1540);
      auVar64 = vmulpd_avx512f(local_1b40,local_1240);
      auVar65 = vmulpd_avx512f(local_2100,local_1800);
      auVar66 = vmulpd_avx512f(local_20c0,local_17c0);
      auVar67 = vmulpd_avx512f(local_1d80,local_1480);
      auVar68 = vmulpd_avx512f(local_1a80,local_1180);
      auVar69 = vmulpd_avx512f(local_2140,local_2140);
      auVar70 = vmulpd_avx512f(local_1e40,local_1e40);
      auVar71 = vmulpd_avx512f(local_2100,local_2100);
      auVar72 = vmulpd_avx512f(local_20c0,local_20c0);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vaddpd_avx512f(auVar69,auVar70);
      auVar69 = vmulpd_avx512f(local_1b40,local_1b40);
      auVar70 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      local_3180 = vaddpd_avx512f(auVar62,auVar64);
      auVar62 = vaddpd_avx512f(auVar63,auVar69);
      auVar63 = vmulpd_avx512f(local_1e00,local_1500);
      auVar62 = vaddpd_avx512f(auVar62,auVar70);
      auVar64 = vmulpd_avx512f(local_1e00,local_1e00);
      auVar63 = vaddpd_avx512f(auVar65,auVar63);
      auVar65 = vmulpd_avx512f(local_1b00,local_1200);
      auVar64 = vaddpd_avx512f(auVar71,auVar64);
      auVar69 = vmulpd_avx512f(local_1b00,local_1b00);
      auVar71 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar64 = vaddpd_avx512f(auVar64,auVar69);
      auVar64 = vaddpd_avx512f(auVar64,auVar70);
      local_3140 = vaddpd_avx512f(auVar63,auVar65);
      auVar63 = vmulpd_avx512f(local_1dc0,local_14c0);
      auVar65 = vmulpd_avx512f(local_1dc0,local_1dc0);
      auVar63 = vaddpd_avx512f(auVar66,auVar63);
      auVar66 = vmulpd_avx512f(local_1ac0,local_11c0);
      auVar65 = vaddpd_avx512f(auVar72,auVar65);
      auVar69 = vmulpd_avx512f(local_1ac0,local_1ac0);
      auVar65 = vaddpd_avx512f(auVar65,auVar69);
      auVar69 = vmulpd_avx512f(local_1d80,local_1d80);
      auVar65 = vaddpd_avx512f(auVar65,auVar70);
      auVar65 = vmulpd_avx512f(auVar65,auVar71);
      local_3100 = vaddpd_avx512f(auVar63,auVar66);
      auVar63 = vmulpd_avx512f(local_2080,local_1780);
      auVar66 = vmulpd_avx512f(local_2080,local_2080);
      auVar66 = vaddpd_avx512f(auVar66,auVar69);
      auVar69 = vmulpd_avx512f(local_1a80,local_1a80);
      auVar66 = vaddpd_avx512f(auVar66,auVar69);
      auVar62 = vmulpd_avx512f(auVar62,auVar71);
      auVar63 = vaddpd_avx512f(auVar63,auVar67);
      auVar66 = vaddpd_avx512f(auVar66,auVar70);
      auVar64 = vmulpd_avx512f(auVar64,auVar71);
      local_30c0 = vaddpd_avx512f(auVar63,auVar68);
      auVar63 = vmulpd_avx512f(auVar66,auVar71);
      dVar3 = pCVar59->m_Alpha;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = dVar3;
      local_f40._8_8_ = local_3180;
      local_f40._0_8_ = dVar3;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar3;
      auVar66 = vbroadcastsd_avx512f(auVar4);
      auVar67 = vmulpd_avx512f(auVar66,local_3180);
      local_2b80 = vaddpd_avx512f(auVar62,auVar67);
      auVar62 = vmulpd_avx512f(auVar66,local_3140);
      local_2b40 = vaddpd_avx512f(auVar64,auVar62);
      auVar62 = vmulpd_avx512f(auVar66,local_3100);
      local_2b00 = vaddpd_avx512f(auVar65,auVar62);
      auVar62 = vmulpd_avx512f(auVar66,local_30c0);
      local_2ac0 = vaddpd_avx512f(auVar63,auVar62);
      if (((pCVar59->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < local_31b8) ||
         ((pCVar59->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) {
LAB_0076b1ee:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0076b203;
      }
      pdVar57 = (pCVar59->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_2b80 = vmulpd_avx512f(local_2b80,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x20));
      local_2580 = local_2000;
      local_2240 = local_1440;
      local_22c0 = local_10c0;
      local_21c0 = local_13c0;
      local_2200 = local_1380;
      local_2300 = local_1080;
      auVar62 = vmulpd_avx512f(local_2000,local_2000);
      auVar63 = vmulpd_avx512f(local_1ec0,local_1ec0);
      local_2840 = local_1040;
      local_540 = local_1640;
      local_27c0 = local_1600;
      local_2740 = local_12c0;
      local_2700 = local_fc0;
      local_26c0 = local_1580;
      local_2680 = local_1280;
      local_2640 = local_f80;
      local_2b40 = vmulpd_avx512f(local_2b40,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x18));
      auVar64 = vmulpd_avx512f(local_2040,local_2040);
      local_2b00 = vmulpd_avx512f(local_2b00,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x10));
      local_25c0 = local_1d40;
      local_2ac0 = vmulpd_avx512f(local_2ac0,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -8));
      auVar65 = vmulpd_avx512f(local_2040,local_1740);
      auVar66 = vmulpd_avx512f(local_1d40,local_1440);
      local_2600 = local_1a40;
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar66 = vmulpd_avx512f(local_1a40,local_1140);
      local_2340 = local_1140;
      auVar67 = vmulpd_avx512f(local_1a40,local_1a40);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      local_2540 = local_1d00;
      auVar66 = vmulpd_avx512f(local_2000,local_1700);
      local_2180 = local_1400;
      auVar68 = vmulpd_avx512f(local_1d00,local_1400);
      local_2500 = local_1a00;
      auVar66 = vaddpd_avx512f(auVar66,auVar68);
      auVar68 = vmulpd_avx512f(local_1a00,local_1100);
      local_2280 = local_1100;
      auVar69 = vmulpd_avx512f(local_1a00,local_1a00);
      auVar66 = vaddpd_avx512f(auVar66,auVar68);
      local_2480 = local_1cc0;
      auVar68 = vmulpd_avx512f(local_1fc0,local_16c0);
      local_24c0 = local_1fc0;
      auVar70 = vmulpd_avx512f(local_1cc0,local_13c0);
      auVar71 = vmulpd_avx512f(local_1fc0,local_1fc0);
      auVar68 = vaddpd_avx512f(auVar68,auVar70);
      auVar70 = vmulpd_avx512f(local_19c0,local_10c0);
      local_2440 = local_19c0;
      auVar72 = vmulpd_avx512f(local_19c0,local_19c0);
      auVar68 = vaddpd_avx512f(auVar68,auVar70);
      auVar70 = vmulpd_avx512f(local_1f80,local_1680);
      local_2400 = local_1f80;
      auVar73 = vmulpd_avx512f(local_1c80,local_1380);
      local_2380 = local_1c80;
      auVar70 = vaddpd_avx512f(auVar70,auVar73);
      auVar73 = vmulpd_avx512f(local_1980,local_1080);
      local_23c0 = local_1980;
      auVar74 = vmulpd_avx512f(local_1d40,local_1d40);
      auVar70 = vaddpd_avx512f(auVar70,auVar73);
      auVar64 = vaddpd_avx512f(auVar64,auVar74);
      auVar64 = vaddpd_avx512f(auVar64,auVar67);
      auVar67 = vmulpd_avx512f(local_1d00,local_1d00);
      auVar62 = vaddpd_avx512f(auVar62,auVar67);
      auVar67 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar62 = vaddpd_avx512f(auVar62,auVar69);
      auVar69 = vmulpd_avx512f(local_1cc0,local_1cc0);
      auVar73 = vmulpd_avx512f(local_1f00,local_1f00);
      local_640 = local_1f00;
      auVar69 = vaddpd_avx512f(auVar71,auVar69);
      auVar71 = vmulpd_avx512f(local_1f80,local_1f80);
      auVar69 = vaddpd_avx512f(auVar69,auVar72);
      auVar72 = vmulpd_avx512f(local_1c80,local_1c80);
      auVar74 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      auVar71 = vaddpd_avx512f(auVar71,auVar72);
      auVar72 = vmulpd_avx512f(local_1980,local_1980);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar3;
      auVar75 = vbroadcastsd_avx512f(auVar5);
      auVar71 = vaddpd_avx512f(auVar71,auVar72);
      auVar64 = vaddpd_avx512f(auVar64,auVar74);
      auVar62 = vaddpd_avx512f(auVar62,auVar74);
      auVar69 = vaddpd_avx512f(auVar69,auVar74);
      auVar71 = vaddpd_avx512f(auVar71,auVar74);
      auVar64 = vmulpd_avx512f(auVar64,auVar67);
      auVar62 = vmulpd_avx512f(auVar62,auVar67);
      auVar69 = vmulpd_avx512f(auVar69,auVar67);
      auVar71 = vmulpd_avx512f(auVar71,auVar67);
      auVar70 = vmulpd_avx512f(auVar75,auVar70);
      auVar70 = vaddpd_avx512f(auVar71,auVar70);
      auVar65 = vmulpd_avx512f(auVar75,auVar65);
      auVar64 = vaddpd_avx512f(auVar64,auVar65);
      auVar65 = vmulpd_avx512f(auVar75,auVar66);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar65 = vmulpd_avx512f(auVar75,auVar68);
      auVar65 = vaddpd_avx512f(auVar69,auVar65);
      local_2c80 = vmulpd_avx512f(auVar64,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x20));
      auVar64 = vmulpd_avx512f(local_1e80,local_1580);
      local_2c40 = vmulpd_avx512f(auVar62,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x18));
      auVar62 = vmulpd_avx512f(local_1c40,local_1340);
      local_5c0 = local_1c40;
      local_2c00 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x10));
      local_2bc0 = vmulpd_avx512f(auVar70,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -8));
      vmovsd_avx512f(auVar81);
      auVar65 = vmulpd_avx512f(local_1f40,local_1640);
      local_580 = local_1f40;
      auVar62 = vaddpd_avx512f(auVar65,auVar62);
      auVar65 = vmulpd_avx512f(local_1940,local_1040);
      local_2780 = local_1300;
      local_600 = local_1940;
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar65 = vmulpd_avx512f(local_1c00,local_1300);
      auVar66 = vmulpd_avx512f(local_18c0,local_fc0);
      auVar68 = vmulpd_avx512f(local_1f00,local_1600);
      auVar65 = vaddpd_avx512f(auVar68,auVar65);
      auVar68 = vmulpd_avx512f(local_1900,local_1000);
      local_2800 = local_1000;
      auVar65 = vaddpd_avx512f(auVar65,auVar68);
      local_2880 = local_15c0;
      auVar68 = vmulpd_avx512f(local_1ec0,local_15c0);
      auVar69 = vmulpd_avx512f(local_1bc0,local_12c0);
      auVar68 = vaddpd_avx512f(auVar68,auVar69);
      auVar66 = vaddpd_avx512f(auVar68,auVar66);
      auVar68 = vmulpd_avx512f(local_1b80,local_1280);
      auVar69 = vmulpd_avx512f(local_1f40,local_1f40);
      auVar64 = vaddpd_avx512f(auVar64,auVar68);
      auVar68 = vmulpd_avx512f(local_1880,local_f80);
      auVar64 = vaddpd_avx512f(auVar64,auVar68);
      auVar68 = vmulpd_avx512f(local_1c40,local_1c40);
      auVar68 = vaddpd_avx512f(auVar69,auVar68);
      auVar69 = vmulpd_avx512f(local_1940,local_1940);
      auVar68 = vaddpd_avx512f(auVar68,auVar69);
      auVar69 = vmulpd_avx512f(local_1c00,local_1c00);
      auVar69 = vaddpd_avx512f(auVar73,auVar69);
      auVar70 = vmulpd_avx512f(local_1900,local_1900);
      auVar68 = vaddpd_avx512f(auVar68,auVar74);
      auVar69 = vaddpd_avx512f(auVar69,auVar70);
      auVar70 = vmulpd_avx512f(local_1bc0,local_1bc0);
      auVar68 = vmulpd_avx512f(auVar68,auVar67);
      auVar63 = vaddpd_avx512f(auVar63,auVar70);
      auVar70 = vmulpd_avx512f(local_18c0,local_18c0);
      auVar71 = vmulpd_avx512f(local_1e80,local_1e80);
      auVar69 = vaddpd_avx512f(auVar69,auVar74);
      auVar63 = vaddpd_avx512f(auVar63,auVar70);
      auVar70 = vmulpd_avx512f(local_1b80,local_1b80);
      auVar69 = vmulpd_avx512f(auVar69,auVar67);
      auVar70 = vaddpd_avx512f(auVar71,auVar70);
      auVar71 = vmulpd_avx512f(local_1880,local_1880);
      auVar63 = vaddpd_avx512f(auVar63,auVar74);
      auVar70 = vaddpd_avx512f(auVar70,auVar71);
      auVar63 = vmulpd_avx512f(auVar63,auVar67);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar3;
      auVar71 = vbroadcastsd_avx512f(auVar6);
      auVar70 = vaddpd_avx512f(auVar70,auVar74);
      auVar67 = vmulpd_avx512f(auVar70,auVar67);
      auVar64 = vmulpd_avx512f(auVar71,auVar64);
      auVar62 = vmulpd_avx512f(auVar71,auVar62);
      auVar64 = vaddpd_avx512f(auVar67,auVar64);
      auVar62 = vaddpd_avx512f(auVar68,auVar62);
      auVar65 = vmulpd_avx512f(auVar71,auVar65);
      auVar65 = vaddpd_avx512f(auVar69,auVar65);
      auVar66 = vmulpd_avx512f(auVar71,auVar66);
      auVar67 = vmulpd_avx512f(local_1ec0,local_16c0);
      auVar63 = vaddpd_avx512f(auVar63,auVar66);
      local_2d80 = vmulpd_avx512f(auVar62,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x20));
      local_2d40 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x18));
      auVar62 = vmulpd_avx512f(local_1740,local_1f40);
      local_2d00 = vmulpd_avx512f(auVar63,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x10));
      auVar63 = vmulpd_avx512f(local_2040,local_1640);
      auVar65 = vmulpd_avx512f(local_1c40,local_1440);
      local_2cc0 = vmulpd_avx512f(auVar64,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -8));
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar64 = vmulpd_avx512f(local_1940,local_1140);
      auVar65 = vmulpd_avx512f(local_1c00,local_1400);
      auVar62 = vaddpd_avx512f(auVar62,auVar64);
      auVar64 = vmulpd_avx512f(local_1d40,local_1340);
      auVar62 = vaddpd_avx512f(auVar63,auVar62);
      auVar63 = vmulpd_avx512f(local_1f00,local_1700);
      auVar62 = vaddpd_avx512f(auVar64,auVar62);
      auVar64 = vmulpd_avx512f(local_1a40,local_1040);
      auVar66 = vmulpd_avx512f(local_1a40,local_1940);
      auVar62 = vaddpd_avx512f(auVar64,auVar62);
      auVar64 = vmulpd_avx512f(local_1d00,local_1300);
      auVar63 = vaddpd_avx512f(auVar63,auVar65);
      auVar65 = vmulpd_avx512f(local_1900,local_1100);
      auVar68 = vmulpd_avx512f(local_1bc0,local_13c0);
      auVar63 = vaddpd_avx512f(auVar63,auVar65);
      auVar65 = vmulpd_avx512f(local_2000,local_1600);
      auVar69 = vmulpd_avx512f(local_2000,local_1f00);
      auVar63 = vaddpd_avx512f(auVar65,auVar63);
      auVar65 = vmulpd_avx512f(local_1a00,local_1000);
      auVar63 = vaddpd_avx512f(auVar64,auVar63);
      auVar64 = vmulpd_avx512f(local_18c0,local_10c0);
      auVar63 = vaddpd_avx512f(auVar65,auVar63);
      auVar65 = vaddpd_avx512f(auVar67,auVar68);
      auVar67 = vmulpd_avx512f(local_1fc0,local_15c0);
      auVar64 = vaddpd_avx512f(auVar65,auVar64);
      auVar64 = vaddpd_avx512f(auVar67,auVar64);
      auVar65 = vmulpd_avx512f(local_1cc0,local_12c0);
      auVar64 = vaddpd_avx512f(auVar65,auVar64);
      auVar65 = vmulpd_avx512f(local_1e80,local_1680);
      auVar67 = vmulpd_avx512f(local_19c0,local_fc0);
      auVar68 = vmulpd_avx512f(local_1880,local_1080);
      auVar64 = vaddpd_avx512f(auVar67,auVar64);
      auVar67 = vmulpd_avx512f(local_1b80,local_1380);
      auVar65 = vaddpd_avx512f(auVar65,auVar67);
      auVar65 = vaddpd_avx512f(auVar65,auVar68);
      auVar67 = vmulpd_avx512f(local_1f80,local_1580);
      auVar65 = vaddpd_avx512f(auVar67,auVar65);
      auVar67 = vmulpd_avx512f(local_1c80,local_1280);
      auVar65 = vaddpd_avx512f(auVar67,auVar65);
      auVar67 = vmulpd_avx512f(local_2040,local_1f40);
      auVar68 = vmulpd_avx512f(local_1fc0,local_1ec0);
      auVar70 = vmulpd_avx512f(local_1980,local_f80);
      auVar71 = vmulpd_avx512f(local_19c0,local_18c0);
      auVar65 = vaddpd_avx512f(auVar70,auVar65);
      auVar70 = vmulpd_avx512f(local_1d40,local_1c40);
      auVar72 = vmulpd_avx512f(local_1f80,local_1e80);
      auVar67 = vaddpd_avx512f(auVar67,auVar70);
      auVar66 = vaddpd_avx512f(auVar67,auVar66);
      auVar67 = vmulpd_avx512f(local_1d00,local_1c00);
      auVar67 = vaddpd_avx512f(auVar69,auVar67);
      auVar69 = vmulpd_avx512f(local_1a00,local_1900);
      auVar67 = vaddpd_avx512f(auVar67,auVar69);
      auVar69 = vmulpd_avx512f(local_1cc0,local_1bc0);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar3;
      auVar70 = vbroadcastsd_avx512f(auVar7);
      auVar68 = vaddpd_avx512f(auVar68,auVar69);
      auVar68 = vaddpd_avx512f(auVar68,auVar71);
      auVar69 = vmulpd_avx512f(local_1c80,local_1b80);
      auVar71 = vmulpd_avx512f(local_18c0,local_1ac0);
      auVar69 = vaddpd_avx512f(auVar72,auVar69);
      auVar72 = vmulpd_avx512f(local_1980,local_1880);
      auVar69 = vaddpd_avx512f(auVar69,auVar72);
      auVar62 = vmulpd_avx512f(auVar70,auVar62);
      auVar62 = vaddpd_avx512f(auVar66,auVar62);
      auVar63 = vmulpd_avx512f(auVar70,auVar63);
      auVar63 = vaddpd_avx512f(auVar67,auVar63);
      auVar64 = vmulpd_avx512f(auVar70,auVar64);
      auVar64 = vaddpd_avx512f(auVar68,auVar64);
      auVar65 = vmulpd_avx512f(auVar70,auVar65);
      auVar65 = vaddpd_avx512f(auVar69,auVar65);
      auVar66 = vmulpd_avx512f(local_1b40,local_1040);
      local_2e80 = vmulpd_avx512f(auVar62,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x20));
      local_2e40 = vmulpd_avx512f(auVar63,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x18));
      local_2900 = local_1240;
      local_2e00 = vmulpd_avx512f(auVar64,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x10));
      auVar62 = vmulpd_avx512f(local_1340,local_1e40);
      local_2dc0 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -8));
      local_28c0 = local_1840;
      auVar63 = vmulpd_avx512f(local_1f40,local_1840);
      auVar64 = vmulpd_avx512f(local_1c00,local_1e00);
      local_2940 = local_1540;
      auVar65 = vmulpd_avx512f(local_1c40,local_1540);
      auVar63 = vaddpd_avx512f(auVar63,auVar65);
      auVar65 = vmulpd_avx512f(local_1940,local_1240);
      auVar63 = vaddpd_avx512f(auVar63,auVar65);
      auVar65 = vmulpd_avx512f(local_2140,local_1640);
      auVar63 = vaddpd_avx512f(auVar63,auVar65);
      auVar65 = vmulpd_avx512f(local_1c00,local_1500);
      auVar67 = vmulpd_avx512f(local_1900,local_1b00);
      auVar62 = vaddpd_avx512f(auVar63,auVar62);
      local_3180 = vaddpd_avx512f(auVar62,auVar66);
      auVar62 = vmulpd_avx512f(local_1f00,local_1800);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar63 = vmulpd_avx512f(local_1300,local_1e00);
      auVar65 = vmulpd_avx512f(local_1900,local_1200);
      auVar66 = vmulpd_avx512f(local_2100,local_1600);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar65 = vmulpd_avx512f(local_1bc0,local_14c0);
      auVar68 = vmulpd_avx512f(local_1bc0,local_1dc0);
      auVar62 = vaddpd_avx512f(auVar62,auVar66);
      auVar66 = vmulpd_avx512f(local_1000,local_1b00);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_20c0,local_15c0);
      local_3140 = vaddpd_avx512f(auVar62,auVar66);
      auVar62 = vmulpd_avx512f(local_1ec0,local_17c0);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar65 = vmulpd_avx512f(local_18c0,local_11c0);
      auVar66 = vmulpd_avx512f(local_1dc0,local_12c0);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1ac0,local_fc0);
      auVar62 = vaddpd_avx512f(auVar62,auVar66);
      auVar65 = vmulpd_avx512f(local_1b80,local_1480);
      local_3100 = vaddpd_avx512f(auVar62,auVar63);
      auVar62 = vmulpd_avx512f(local_1e80,local_1780);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar63 = vmulpd_avx512f(local_1880,local_1180);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_2080,local_1580);
      auVar65 = vmulpd_avx512f(local_1e80,local_2080);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1d80,local_1280);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1a80,local_f80);
      local_30c0 = vaddpd_avx512f(auVar62,auVar63);
      auVar62 = vmulpd_avx512f(local_2140,local_1f40);
      auVar63 = vmulpd_avx512f(local_1e40,local_1c40);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1b40,local_1940);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_2100,local_1f00);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar63 = vaddpd_avx512f(auVar63,auVar67);
      auVar64 = vmulpd_avx512f(local_1ec0,local_20c0);
      auVar64 = vaddpd_avx512f(auVar64,auVar68);
      auVar64 = vaddpd_avx512f(auVar64,auVar71);
      auVar66 = vmulpd_avx512f(local_1b80,local_1d80);
      auVar67 = vmulpd_avx512f(local_1880,local_1a80);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar65 = vaddpd_avx512f(auVar65,auVar67);
      local_f40._0_8_ = pCVar59->m_Alpha;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_f40._0_8_;
      auVar66 = vbroadcastsd_avx512f(auVar8);
      auVar67 = vmulpd_avx512f(auVar66,local_3180);
      auVar68 = vmulpd_avx512f(auVar66,local_30c0);
      local_2f80 = vaddpd_avx512f(auVar62,auVar67);
      auVar62 = vmulpd_avx512f(auVar66,local_3140);
      local_2f40 = vaddpd_avx512f(auVar63,auVar62);
      auVar62 = vmulpd_avx512f(auVar66,local_3100);
      local_2f00 = vaddpd_avx512f(auVar64,auVar62);
      local_2ec0 = vaddpd_avx512f(auVar65,auVar68);
      local_3198 = dVar3;
      if (((pCVar59->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < local_31b8) ||
         ((pCVar59->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_0076b1ee;
      pdVar57 = (pCVar59->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar62 = vmulpd_avx512f(local_2140,local_1740);
      auVar63 = vmulpd_avx512f(local_1e40,local_1440);
      auVar64 = vmulpd_avx512f(local_2100,local_1700);
      local_2f80 = vmulpd_avx512f(local_2f80,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x20));
      local_2f40 = vmulpd_avx512f(local_2f40,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x18));
      auVar65 = vmulpd_avx512f(local_2140,local_2040);
      local_2f00 = vmulpd_avx512f(local_2f00,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x10));
      auVar66 = vmulpd_avx512f(local_2040,local_1840);
      local_2ec0 = vmulpd_avx512f(local_2ec0,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -8));
      auVar67 = vmulpd_avx512f(local_1d40,local_1540);
      auVar68 = vmulpd_avx512f(local_1e40,local_1d40);
      auVar66 = vaddpd_avx512f(auVar66,auVar67);
      auVar65 = vaddpd_avx512f(auVar65,auVar68);
      auVar67 = vmulpd_avx512f(local_1a40,local_1240);
      auVar68 = vmulpd_avx512f(local_1b40,local_1a40);
      auVar66 = vaddpd_avx512f(auVar66,auVar67);
      auVar65 = vaddpd_avx512f(auVar65,auVar68);
      auVar62 = vaddpd_avx512f(auVar66,auVar62);
      auVar66 = vmulpd_avx512f(local_1b40,local_1140);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1500,local_1d00);
      auVar67 = vmulpd_avx512f(local_1e00,local_1d00);
      local_3180 = vaddpd_avx512f(auVar62,auVar66);
      auVar62 = vmulpd_avx512f(local_1e00,local_1400);
      auVar66 = vmulpd_avx512f(local_1800,local_2000);
      auVar68 = vmulpd_avx512f(local_2100,local_2000);
      auVar63 = vaddpd_avx512f(auVar66,auVar63);
      auVar66 = vmulpd_avx512f(local_14c0,local_1cc0);
      auVar69 = vmulpd_avx512f(local_1200,local_1a00);
      auVar70 = vmulpd_avx512f(local_1b00,local_1a00);
      auVar63 = vaddpd_avx512f(auVar63,auVar69);
      auVar69 = vmulpd_avx512f(local_11c0,local_19c0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_1b00,local_1100);
      auVar71 = vmulpd_avx512f(local_1180,local_1980);
      auVar62 = vaddpd_avx512f(auVar63,auVar62);
      auVar63 = vmulpd_avx512f(local_20c0,local_16c0);
      local_3140 = vaddpd_avx512f(auVar62,auVar64);
      auVar62 = vmulpd_avx512f(local_1dc0,local_13c0);
      auVar64 = vmulpd_avx512f(local_17c0,local_1fc0);
      auVar72 = vmulpd_avx512f(local_20c0,local_1fc0);
      auVar64 = vaddpd_avx512f(auVar64,auVar66);
      auVar64 = vaddpd_avx512f(auVar64,auVar69);
      auVar66 = vmulpd_avx512f(local_1780,local_1f80);
      auVar63 = vaddpd_avx512f(auVar64,auVar63);
      auVar64 = vmulpd_avx512f(local_1ac0,local_10c0);
      auVar62 = vaddpd_avx512f(auVar63,auVar62);
      auVar63 = vmulpd_avx512f(local_1d80,local_1380);
      auVar69 = vmulpd_avx512f(local_1480,local_1c80);
      auVar66 = vaddpd_avx512f(auVar66,auVar69);
      auVar69 = vmulpd_avx512f(local_1a80,local_1980);
      local_3100 = vaddpd_avx512f(auVar62,auVar64);
      auVar62 = vmulpd_avx512f(local_2080,local_1680);
      auVar64 = vaddpd_avx512f(auVar66,auVar71);
      auVar66 = vaddpd_avx512f(auVar68,auVar67);
      auVar67 = vmulpd_avx512f(local_1ac0,local_19c0);
      auVar68 = vmulpd_avx512f(local_2080,local_1f80);
      auVar66 = vaddpd_avx512f(auVar66,auVar70);
      auVar70 = vmulpd_avx512f(local_1dc0,local_1cc0);
      auVar70 = vaddpd_avx512f(auVar72,auVar70);
      auVar71 = vmulpd_avx512f(local_1d80,local_1c80);
      auVar62 = vaddpd_avx512f(auVar64,auVar62);
      auVar64 = vmulpd_avx512f(local_1a80,local_1080);
      auVar68 = vaddpd_avx512f(auVar68,auVar71);
      auVar67 = vaddpd_avx512f(auVar70,auVar67);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vaddpd_avx512f(auVar68,auVar69);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_f40._0_8_;
      auVar68 = vbroadcastsd_avx512f(auVar9);
      local_30c0 = vaddpd_avx512f(auVar62,auVar64);
      auVar62 = vmulpd_avx512f(auVar68,local_30c0);
      auVar64 = vmulpd_avx512f(auVar68,local_3180);
      auVar62 = vaddpd_avx512f(auVar63,auVar62);
      auVar63 = vaddpd_avx512f(auVar65,auVar64);
      auVar64 = vmulpd_avx512f(auVar68,local_3140);
      auVar64 = vaddpd_avx512f(auVar66,auVar64);
      auVar65 = vmulpd_avx512f(auVar68,local_3100);
      auVar65 = vaddpd_avx512f(auVar67,auVar65);
      local_3080 = vmulpd_avx512f(auVar63,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x20));
      local_3040 = vmulpd_avx512f(auVar64,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x18));
      local_3000 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -0x10));
      local_2fc0 = vmulpd_avx512f(auVar62,*(undefined1 (*) [64])(pdVar57 + local_31b8 + -8));
      pLVar61 = (pCVar59->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar46 = *(long *)((long)&pLVar61[-1].m_material.
                                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + local_31b8);
      pCVar59 = *(ChElementShellANCF_3443 **)((long)pLVar61 + local_31b8 + -0x18);
      if (pCVar59 == (ChElementShellANCF_3443 *)0x0) {
        pCVar59 = (ChElementShellANCF_3443 *)local_2a60;
        memcpy(pCVar59,(void *)(lVar46 + 0x20),0x120);
        this = local_3200;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar1 = &(pCVar59->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar1 = &(pCVar59->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy(local_2a60,(void *)(lVar46 + 0x20),0x120);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar59);
        pLVar61 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      RotateReorderStiffnessMatrix
                (pCVar59,(ChMatrixNM<double,_6,_6> *)local_2a60,
                 *(double *)((long)pLVar61 + lVar60 + -8));
      uVar58 = local_3188;
      lVar60 = local_3190;
      lVar46 = local_31f8;
      local_31f0._8_8_ = local_2c80;
      local_3238 = local_2d80;
      local_3208 = local_2e80;
      local_3218 = local_2f80;
      local_3228 = local_3080;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_2a60._8_8_;
      auVar62 = vbroadcastsd_avx512f(auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_2a60._0_8_;
      auVar63 = vbroadcastsd_avx512f(auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_2a60._40_8_;
      auVar64 = vbroadcastsd_avx512f(auVar12);
      auVar65 = vmulpd_avx512f(auVar63,local_2b80);
      auVar66 = vmulpd_avx512f(auVar62,local_2c80);
      auVar67 = vmulpd_avx512f(auVar64,local_3080);
      auVar68 = vmulpd_avx512f(auVar62,local_2c40);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_2a60._16_8_;
      auVar66 = vbroadcastsd_avx512f(auVar13);
      auVar69 = vmulpd_avx512f(auVar66,local_2d80);
      auVar65 = vaddpd_avx512f(auVar65,auVar69);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_2a60._24_8_;
      auVar69 = vbroadcastsd_avx512f(auVar14);
      auVar70 = vmulpd_avx512f(auVar69,local_2e80);
      auVar65 = vaddpd_avx512f(auVar65,auVar70);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_2a60._32_8_;
      auVar70 = vbroadcastsd_avx512f(auVar15);
      auVar71 = vmulpd_avx512f(auVar70,local_2f80);
      auVar65 = vaddpd_avx512f(auVar65,auVar71);
      auVar71 = vmulpd_avx512f(auVar64,local_3000);
      auVar65 = vaddpd_avx512f(auVar65,auVar67);
      auVar67 = vmulpd_avx512f(auVar63,local_2b40);
      auVar72 = vmulpd_avx512f(auVar66,local_2d40);
      auVar67 = vaddpd_avx512f(auVar67,auVar68);
      auVar68 = vmulpd_avx512f(auVar69,local_2e40);
      auVar67 = vaddpd_avx512f(auVar67,auVar72);
      auVar72 = vmulpd_avx512f(auVar70,local_2f40);
      auVar67 = vaddpd_avx512f(auVar67,auVar68);
      auVar68 = vmulpd_avx512f(auVar64,local_3040);
      auVar64 = vmulpd_avx512f(auVar64,local_2fc0);
      auVar67 = vaddpd_avx512f(auVar67,auVar72);
      auVar72 = vmulpd_avx512f(auVar62,local_2c00);
      auVar67 = vaddpd_avx512f(auVar67,auVar68);
      auVar68 = vmulpd_avx512f(auVar63,local_2b00);
      auVar73 = vmulpd_avx512f(auVar66,local_2d00);
      auVar63 = vmulpd_avx512f(auVar63,local_2ac0);
      auVar68 = vaddpd_avx512f(auVar68,auVar72);
      auVar72 = vmulpd_avx512f(auVar69,local_2e00);
      auVar68 = vaddpd_avx512f(auVar68,auVar73);
      auVar73 = vmulpd_avx512f(auVar70,local_2f00);
      auVar68 = vaddpd_avx512f(auVar68,auVar72);
      auVar62 = vmulpd_avx512f(auVar62,local_2bc0);
      auVar68 = vaddpd_avx512f(auVar68,auVar73);
      auVar66 = vmulpd_avx512f(auVar66,local_2cc0);
      auVar68 = vaddpd_avx512f(auVar68,auVar71);
      auVar62 = vaddpd_avx512f(auVar63,auVar62);
      auVar63 = vmulpd_avx512f(auVar69,local_2dc0);
      auVar62 = vaddpd_avx512f(auVar62,auVar66);
      auVar66 = vmulpd_avx512f(auVar70,local_2ec0);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_2a60._56_8_;
      auVar69 = vbroadcastsd_avx512f(auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_2a60._64_8_;
      auVar70 = vbroadcastsd_avx512f(auVar17);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar62 = vaddpd_avx512f(auVar62,auVar66);
      auVar62 = vaddpd_avx512f(auVar62,auVar64);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_2a60._48_8_;
      auVar63 = vbroadcastsd_avx512f(auVar18);
      auVar64 = vmulpd_avx512f(auVar69,local_2c80);
      auVar66 = vmulpd_avx512f(auVar70,local_2d80);
      auVar71 = vmulpd_avx512f(auVar63,local_2b80);
      auVar72 = vmulpd_avx512f(auVar63,local_2b40);
      auVar64 = vaddpd_avx512f(auVar71,auVar64);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_2a60._72_8_;
      auVar71 = vbroadcastsd_avx512f(auVar19);
      auVar73 = vmulpd_avx512f(auVar71,local_2e80);
      auVar74 = vmulpd_avx512f(auVar71,local_2e40);
      auVar64 = vaddpd_avx512f(auVar64,auVar66);
      auVar64 = vaddpd_avx512f(auVar64,auVar73);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_2a60._80_8_;
      auVar66 = vbroadcastsd_avx512f(auVar20);
      auVar73 = vmulpd_avx512f(auVar66,local_2f80);
      auVar64 = vaddpd_avx512f(auVar64,auVar73);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_2a60._88_8_;
      auVar73 = vbroadcastsd_avx512f(auVar21);
      auVar75 = vmulpd_avx512f(auVar73,local_3080);
      local_28c0 = vaddpd_avx512f(auVar64,auVar75);
      auVar64 = vmulpd_avx512f(auVar69,local_2c40);
      auVar64 = vaddpd_avx512f(auVar72,auVar64);
      auVar72 = vmulpd_avx512f(auVar70,local_2d40);
      auVar75 = vmulpd_avx512f(auVar69,local_2c00);
      auVar69 = vmulpd_avx512f(auVar69,local_2bc0);
      auVar64 = vaddpd_avx512f(auVar64,auVar72);
      auVar72 = vmulpd_avx512f(auVar66,local_2f40);
      auVar64 = vaddpd_avx512f(auVar64,auVar74);
      auVar74 = vmulpd_avx512f(auVar73,local_3040);
      auVar64 = vaddpd_avx512f(auVar64,auVar72);
      local_2940 = vaddpd_avx512f(auVar64,auVar74);
      auVar64 = vmulpd_avx512f(auVar63,local_2b00);
      auVar63 = vmulpd_avx512f(auVar63,local_2ac0);
      auVar64 = vaddpd_avx512f(auVar64,auVar75);
      auVar72 = vmulpd_avx512f(auVar70,local_2d00);
      auVar63 = vaddpd_avx512f(auVar63,auVar69);
      auVar69 = vmulpd_avx512f(auVar71,local_2dc0);
      auVar74 = vmulpd_avx512f(auVar73,local_2fc0);
      auVar64 = vaddpd_avx512f(auVar64,auVar72);
      auVar71 = vmulpd_avx512f(auVar71,local_2e00);
      auVar64 = vaddpd_avx512f(auVar64,auVar71);
      auVar71 = vmulpd_avx512f(auVar66,local_2f00);
      auVar64 = vaddpd_avx512f(auVar64,auVar71);
      auVar71 = vmulpd_avx512f(auVar73,local_3000);
      local_21c0 = vaddpd_avx512f(auVar64,auVar71);
      auVar64 = vmulpd_avx512f(auVar70,local_2cc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(auVar66,local_2ec0);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_29e8;
      auVar66 = vbroadcastsd_avx512f(auVar22);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_29e0;
      auVar70 = vbroadcastsd_avx512f(auVar23);
      auVar63 = vaddpd_avx512f(auVar63,auVar69);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      local_2240 = vaddpd_avx512f(auVar63,auVar74);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_2a00;
      auVar63 = vbroadcastsd_avx512f(auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_29f8;
      auVar64 = vbroadcastsd_avx512f(auVar25);
      auVar69 = vmulpd_avx512f(auVar63,local_2b80);
      auVar71 = vmulpd_avx512f(auVar66,local_2e80);
      auVar72 = vmulpd_avx512f(auVar70,local_2f80);
      auVar73 = vmulpd_avx512f(auVar64,local_2c80);
      auVar69 = vaddpd_avx512f(auVar69,auVar73);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_29f0;
      auVar73 = vbroadcastsd_avx512f(auVar26);
      auVar74 = vmulpd_avx512f(auVar73,local_2d80);
      auVar75 = vmulpd_avx512f(auVar73,local_2d40);
      auVar69 = vaddpd_avx512f(auVar69,auVar74);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_29d8;
      auVar74 = vbroadcastsd_avx512f(auVar27);
      auVar69 = vaddpd_avx512f(auVar69,auVar71);
      auVar71 = vmulpd_avx512f(auVar63,local_2b40);
      auVar69 = vaddpd_avx512f(auVar69,auVar72);
      auVar72 = vmulpd_avx512f(auVar74,local_3080);
      local_2880 = vaddpd_avx512f(auVar69,auVar72);
      auVar69 = vmulpd_avx512f(auVar64,local_2c40);
      auVar69 = vaddpd_avx512f(auVar71,auVar69);
      auVar71 = vmulpd_avx512f(auVar66,local_2e40);
      auVar72 = vmulpd_avx512f(auVar64,local_2c00);
      auVar69 = vaddpd_avx512f(auVar69,auVar75);
      auVar75 = vmulpd_avx512f(auVar70,local_2f40);
      auVar69 = vaddpd_avx512f(auVar69,auVar71);
      auVar71 = vmulpd_avx512f(auVar74,local_3040);
      auVar69 = vaddpd_avx512f(auVar69,auVar75);
      auVar75 = vmulpd_avx512f(auVar63,local_2b00);
      auVar63 = vmulpd_avx512f(auVar63,local_2ac0);
      local_2900 = vaddpd_avx512f(auVar69,auVar71);
      auVar69 = vmulpd_avx512f(auVar66,local_2e00);
      auVar71 = vaddpd_avx512f(auVar75,auVar72);
      auVar72 = vmulpd_avx512f(auVar73,local_2d00);
      auVar75 = vmulpd_avx512f(auVar74,local_3000);
      auVar71 = vaddpd_avx512f(auVar71,auVar72);
      auVar72 = vmulpd_avx512f(auVar70,local_2f00);
      auVar70 = vmulpd_avx512f(auVar70,local_2ec0);
      auVar69 = vaddpd_avx512f(auVar71,auVar69);
      auVar64 = vmulpd_avx512f(auVar64,local_2bc0);
      auVar69 = vaddpd_avx512f(auVar69,auVar72);
      auVar71 = vmulpd_avx512f(auVar73,local_2cc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(auVar66,local_2dc0);
      local_2180 = vaddpd_avx512f(auVar69,auVar75);
      auVar66 = vmulpd_avx512f(auVar74,local_2fc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar71);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar63 = vaddpd_avx512f(auVar63,auVar70);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_29a8;
      auVar64 = vbroadcastsd_avx512f(auVar28);
      local_2200 = vaddpd_avx512f(auVar63,auVar66);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_29d0;
      auVar63 = vbroadcastsd_avx512f(auVar29);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_29c8;
      auVar66 = vbroadcastsd_avx512f(auVar30);
      auVar69 = vmulpd_avx512f(auVar63,local_2b80);
      auVar70 = vmulpd_avx512f(auVar64,local_3080);
      auVar71 = vmulpd_avx512f(auVar66,local_2c80);
      auVar69 = vaddpd_avx512f(auVar69,auVar71);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_29c0;
      auVar71 = vbroadcastsd_avx512f(auVar31);
      auVar72 = vmulpd_avx512f(auVar71,local_2d80);
      auVar73 = vmulpd_avx512f(auVar71,local_2d40);
      auVar69 = vaddpd_avx512f(auVar69,auVar72);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_29b8;
      auVar72 = vbroadcastsd_avx512f(auVar32);
      auVar74 = vmulpd_avx512f(auVar72,local_2e80);
      auVar69 = vaddpd_avx512f(auVar69,auVar74);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_29b0;
      auVar74 = vbroadcastsd_avx512f(auVar33);
      auVar75 = vmulpd_avx512f(auVar74,local_2f80);
      auVar69 = vaddpd_avx512f(auVar69,auVar75);
      auVar75 = vmulpd_avx512f(auVar66,local_2c40);
      local_2280 = vaddpd_avx512f(auVar69,auVar70);
      auVar69 = vmulpd_avx512f(auVar63,local_2b40);
      auVar69 = vaddpd_avx512f(auVar69,auVar75);
      auVar70 = vmulpd_avx512f(auVar72,local_2e40);
      auVar75 = vmulpd_avx512f(auVar66,local_2c00);
      auVar69 = vaddpd_avx512f(auVar69,auVar73);
      auVar73 = vmulpd_avx512f(auVar74,local_2f40);
      auVar69 = vaddpd_avx512f(auVar69,auVar70);
      auVar70 = vmulpd_avx512f(auVar64,local_3040);
      auVar69 = vaddpd_avx512f(auVar69,auVar73);
      auVar73 = vmulpd_avx512f(auVar63,local_2b00);
      auVar63 = vmulpd_avx512f(auVar63,local_2ac0);
      local_22c0 = vaddpd_avx512f(auVar69,auVar70);
      auVar69 = vmulpd_avx512f(auVar72,local_2e00);
      auVar70 = vaddpd_avx512f(auVar73,auVar75);
      auVar73 = vmulpd_avx512f(auVar71,local_2d00);
      auVar71 = vmulpd_avx512f(auVar71,local_2cc0);
      auVar70 = vaddpd_avx512f(auVar70,auVar73);
      auVar73 = vmulpd_avx512f(auVar74,local_2f00);
      auVar69 = vaddpd_avx512f(auVar70,auVar69);
      auVar70 = vmulpd_avx512f(auVar64,local_3000);
      auVar69 = vaddpd_avx512f(auVar69,auVar73);
      local_2300 = vaddpd_avx512f(auVar69,auVar70);
      auVar66 = vmulpd_avx512f(auVar66,local_2bc0);
      auVar64 = vmulpd_avx512f(auVar64,local_2fc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar66);
      auVar66 = vmulpd_avx512f(auVar72,local_2dc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar71);
      auVar69 = vmulpd_avx512f(auVar74,local_2ec0);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_2990;
      auVar70 = vbroadcastsd_avx512f(auVar34);
      auVar63 = vaddpd_avx512f(auVar63,auVar66);
      auVar63 = vaddpd_avx512f(auVar63,auVar69);
      local_2340 = vaddpd_avx512f(auVar63,auVar64);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_29a0;
      auVar63 = vbroadcastsd_avx512f(auVar35);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_2998;
      auVar64 = vbroadcastsd_avx512f(auVar36);
      auVar66 = vmulpd_avx512f(auVar63,local_2b80);
      auVar69 = vmulpd_avx512f(auVar70,local_2d80);
      auVar71 = vmulpd_avx512f(auVar70,local_2d40);
      auVar72 = vmulpd_avx512f(auVar64,local_2c80);
      auVar73 = vmulpd_avx512f(auVar64,local_2c40);
      auVar66 = vaddpd_avx512f(auVar66,auVar72);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_2988;
      auVar72 = vbroadcastsd_avx512f(auVar37);
      auVar66 = vaddpd_avx512f(auVar66,auVar69);
      auVar69 = vmulpd_avx512f(auVar72,local_2e80);
      auVar66 = vaddpd_avx512f(auVar66,auVar69);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_2980;
      auVar69 = vbroadcastsd_avx512f(auVar38);
      auVar74 = vmulpd_avx512f(auVar69,local_2f80);
      auVar66 = vaddpd_avx512f(auVar66,auVar74);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_2978;
      auVar74 = vbroadcastsd_avx512f(auVar39);
      auVar75 = vmulpd_avx512f(auVar74,local_3080);
      local_2600 = vaddpd_avx512f(auVar66,auVar75);
      auVar66 = vmulpd_avx512f(auVar63,local_2b40);
      auVar75 = vmulpd_avx512f(auVar70,local_2d00);
      auVar66 = vaddpd_avx512f(auVar66,auVar73);
      auVar73 = vmulpd_avx512f(auVar72,local_2e40);
      auVar66 = vaddpd_avx512f(auVar66,auVar71);
      auVar71 = vmulpd_avx512f(auVar69,local_2f40);
      auVar66 = vaddpd_avx512f(auVar66,auVar73);
      auVar73 = vmulpd_avx512f(auVar74,local_3040);
      auVar66 = vaddpd_avx512f(auVar66,auVar71);
      auVar71 = vmulpd_avx512f(auVar64,local_2c00);
      auVar64 = vmulpd_avx512f(auVar64,local_2bc0);
      local_2640 = vaddpd_avx512f(auVar66,auVar73);
      auVar66 = vmulpd_avx512f(auVar63,local_2b00);
      auVar63 = vmulpd_avx512f(auVar63,local_2ac0);
      auVar66 = vaddpd_avx512f(auVar66,auVar71);
      auVar70 = vmulpd_avx512f(auVar70,local_2cc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vaddpd_avx512f(auVar66,auVar75);
      auVar66 = vmulpd_avx512f(auVar72,local_2e00);
      auVar63 = vaddpd_avx512f(auVar63,auVar70);
      auVar70 = vmulpd_avx512f(auVar69,local_2ec0);
      auVar64 = vaddpd_avx512f(auVar64,auVar66);
      auVar66 = vmulpd_avx512f(auVar69,local_2f00);
      auVar64 = vaddpd_avx512f(auVar64,auVar66);
      auVar66 = vmulpd_avx512f(auVar74,local_3000);
      local_2680 = vaddpd_avx512f(auVar64,auVar66);
      auVar64 = vmulpd_avx512f(auVar72,local_2dc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(auVar74,local_2fc0);
      local_3240 = local_2960;
      local_3210 = local_2958;
      local_3220 = local_2950;
      local_3230 = local_2948;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_2960;
      auVar66 = vbroadcastsd_avx512f(auVar40);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_2958;
      auVar69 = vbroadcastsd_avx512f(auVar41);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_2948;
      auVar71 = vbroadcastsd_avx512f(auVar42);
      auVar63 = vaddpd_avx512f(auVar63,auVar70);
      local_31f0._0_8_ = local_2968;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_2950;
      auVar70 = vbroadcastsd_avx512f(auVar43);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_2968;
      auVar72 = vbroadcastsd_avx512f(auVar44);
      local_26c0 = vaddpd_avx512f(auVar63,auVar64);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_2970;
      auVar63 = vbroadcastsd_avx512f(auVar45);
      auVar64 = vmulpd_avx512f(auVar72,local_2c80);
      auVar73 = vmulpd_avx512f(auVar66,local_2d80);
      auVar74 = vmulpd_avx512f(auVar69,local_2e80);
      auVar75 = vmulpd_avx512f(auVar70,local_2f80);
      auVar76 = vmulpd_avx512f(auVar72,local_2c40);
      auVar77 = vmulpd_avx512f(auVar66,local_2d40);
      auVar78 = vmulpd_avx512f(auVar63,local_2b80);
      auVar64 = vaddpd_avx512f(auVar78,auVar64);
      auVar78 = vmulpd_avx512f(auVar66,local_2cc0);
      auVar64 = vaddpd_avx512f(auVar64,auVar73);
      auVar64 = vaddpd_avx512f(auVar64,auVar74);
      auVar64 = vaddpd_avx512f(auVar64,auVar75);
      auVar73 = vmulpd_avx512f(auVar71,local_3080);
      auVar64 = vaddpd_avx512f(auVar64,auVar73);
      auVar73 = vmulpd_avx512f(auVar63,local_2b40);
      auVar73 = vaddpd_avx512f(auVar73,auVar76);
      auVar74 = vmulpd_avx512f(auVar69,local_2e40);
      auVar73 = vaddpd_avx512f(auVar73,auVar77);
      auVar75 = vmulpd_avx512f(auVar70,local_2f40);
      auVar73 = vaddpd_avx512f(auVar73,auVar74);
      auVar74 = vmulpd_avx512f(auVar71,local_3040);
      auVar73 = vaddpd_avx512f(auVar73,auVar75);
      auVar75 = vmulpd_avx512f(auVar72,local_2c00);
      auVar72 = vmulpd_avx512f(auVar72,local_2bc0);
      auVar73 = vaddpd_avx512f(auVar73,auVar74);
      auVar74 = vmulpd_avx512f(auVar63,local_2b00);
      auVar63 = vmulpd_avx512f(auVar63,local_2ac0);
      auVar66 = vmulpd_avx512f(auVar66,local_2d00);
      auVar63 = vaddpd_avx512f(auVar63,auVar72);
      auVar72 = vmulpd_avx512f(auVar69,local_2dc0);
      auVar74 = vaddpd_avx512f(auVar74,auVar75);
      auVar69 = vmulpd_avx512f(auVar69,local_2e00);
      auVar63 = vaddpd_avx512f(auVar63,auVar78);
      auVar75 = vmulpd_avx512f(auVar70,local_2ec0);
      auVar66 = vaddpd_avx512f(auVar74,auVar66);
      auVar70 = vmulpd_avx512f(auVar70,local_2f00);
      auVar74 = vmulpd_avx512f(local_2640,local_1c00);
      local_2440 = local_1f40;
      auVar63 = vaddpd_avx512f(auVar63,auVar72);
      auVar72 = vmulpd_avx512f(auVar71,local_2fc0);
      auVar66 = vaddpd_avx512f(auVar66,auVar69);
      auVar69 = vmulpd_avx512f(auVar71,local_3000);
      auVar63 = vaddpd_avx512f(auVar63,auVar75);
      auVar66 = vaddpd_avx512f(auVar66,auVar70);
      auVar63 = vaddpd_avx512f(auVar63,auVar72);
      auVar66 = vaddpd_avx512f(auVar66,auVar69);
      auVar69 = vmulpd_avx512f(auVar64,local_2040);
      local_23c0 = local_2040;
      local_2380 = local_2140;
      auVar70 = vmulpd_avx512f(auVar65,local_2140);
      local_2400 = local_2100;
      auVar71 = vmulpd_avx512f(local_2680,local_1bc0);
      local_2480 = local_2000;
      auVar69 = vaddpd_avx512f(auVar70,auVar69);
      auVar70 = vmulpd_avx512f(local_2600,local_1f40);
      auVar72 = vmulpd_avx512f(local_2600,local_1c40);
      _local_f40 = vaddpd_avx512f(auVar69,auVar70);
      auVar69 = vmulpd_avx512f(auVar73,local_2000);
      auVar70 = vmulpd_avx512f(auVar67,local_2100);
      auVar69 = vaddpd_avx512f(auVar70,auVar69);
      local_2500 = local_20c0;
      auVar70 = vmulpd_avx512f(local_2640,local_1f00);
      local_24c0 = local_1f00;
      local_f00 = vaddpd_avx512f(auVar69,auVar70);
      auVar69 = vmulpd_avx512f(auVar68,local_20c0);
      auVar70 = vmulpd_avx512f(auVar66,local_1fc0);
      local_2540 = local_1fc0;
      auVar69 = vaddpd_avx512f(auVar69,auVar70);
      auVar70 = vmulpd_avx512f(local_2680,local_1ec0);
      local_2580 = local_1ec0;
      auVar75 = vmulpd_avx512f(local_26c0,local_1e80);
      local_25c0 = local_1f80;
      local_ec0 = vaddpd_avx512f(auVar69,auVar70);
      auVar69 = vmulpd_avx512f(auVar63,local_1f80);
      auVar70 = vmulpd_avx512f(auVar62,local_2080);
      auVar69 = vaddpd_avx512f(auVar70,auVar69);
      auVar70 = vmulpd_avx512f(auVar64,local_1d40);
      local_e80 = vaddpd_avx512f(auVar69,auVar75);
      auVar69 = vmulpd_avx512f(auVar65,local_1e40);
      auVar75 = vmulpd_avx512f(auVar64,local_1e40);
      auVar69 = vaddpd_avx512f(auVar69,auVar70);
      auVar70 = vmulpd_avx512f(auVar73,local_1d00);
      local_c40 = vaddpd_avx512f(auVar69,auVar72);
      auVar69 = vmulpd_avx512f(auVar67,local_1e00);
      auVar72 = vmulpd_avx512f(auVar73,local_1e00);
      auVar69 = vaddpd_avx512f(auVar69,auVar70);
      auVar70 = vmulpd_avx512f(auVar66,local_1cc0);
      local_c00 = vaddpd_avx512f(auVar69,auVar74);
      auVar69 = vmulpd_avx512f(auVar68,local_1dc0);
      auVar74 = vmulpd_avx512f(auVar66,local_1dc0);
      auVar69 = vaddpd_avx512f(auVar69,auVar70);
      auVar70 = vmulpd_avx512f(auVar63,local_1c80);
      auVar76 = vmulpd_avx512f(local_26c0,local_1b80);
      local_bc0 = vaddpd_avx512f(auVar69,auVar71);
      auVar65 = vmulpd_avx512f(auVar65,local_1b40);
      auVar69 = vmulpd_avx512f(auVar64,local_1b40);
      auVar71 = vmulpd_avx512f(auVar62,local_1d80);
      auVar77 = vmulpd_avx512f(auVar63,local_1d80);
      auVar70 = vaddpd_avx512f(auVar71,auVar70);
      auVar71 = vmulpd_avx512f(auVar64,local_1a40);
      local_b80 = vaddpd_avx512f(auVar70,auVar76);
      auVar65 = vaddpd_avx512f(auVar65,auVar71);
      auVar70 = vmulpd_avx512f(local_2600,local_1940);
      local_2700 = local_1940;
      local_940 = vaddpd_avx512f(auVar65,auVar70);
      auVar65 = vmulpd_avx512f(auVar73,local_1a00);
      auVar67 = vmulpd_avx512f(auVar67,local_1b00);
      local_2740 = local_1b00;
      auVar70 = vmulpd_avx512f(local_2640,local_1900);
      auVar65 = vaddpd_avx512f(auVar67,auVar65);
      local_900 = vaddpd_avx512f(auVar65,auVar70);
      auVar65 = vmulpd_avx512f(auVar66,local_19c0);
      local_2780 = local_19c0;
      auVar67 = vmulpd_avx512f(auVar66,local_20c0);
      auVar68 = vmulpd_avx512f(auVar68,local_1ac0);
      auVar66 = vmulpd_avx512f(auVar66,local_1ac0);
      auVar65 = vaddpd_avx512f(auVar68,auVar65);
      auVar68 = vmulpd_avx512f(local_2680,local_18c0);
      local_27c0 = local_18c0;
      local_8c0 = vaddpd_avx512f(auVar65,auVar68);
      auVar65 = vmulpd_avx512f(local_26c0,local_1880);
      auVar68 = vmulpd_avx512f(local_22c0,local_1c00);
      auVar70 = vmulpd_avx512f(local_22c0,local_1900);
      auVar62 = vmulpd_avx512f(auVar62,local_1a80);
      local_2800 = local_1a80;
      auVar71 = vmulpd_avx512f(local_2280,local_1c40);
      auVar76 = vmulpd_avx512f(auVar63,local_1980);
      local_2840 = local_1980;
      auVar78 = vmulpd_avx512f(auVar73,local_2100);
      auVar79 = vmulpd_avx512f(local_28c0,local_1a40);
      auVar80 = vmulpd_avx512f(local_28c0,local_1d40);
      auVar62 = vaddpd_avx512f(auVar62,auVar76);
      auVar64 = vmulpd_avx512f(auVar64,local_2140);
      auVar69 = vaddpd_avx512f(auVar69,auVar79);
      auVar73 = vmulpd_avx512f(auVar73,local_1b00);
      auVar75 = vaddpd_avx512f(auVar75,auVar80);
      local_880 = vaddpd_avx512f(auVar62,auVar65);
      auVar62 = vmulpd_avx512f(local_28c0,local_2040);
      auVar65 = vmulpd_avx512f(local_2280,local_1940);
      local_b40 = vaddpd_avx512f(auVar75,auVar71);
      auVar62 = vaddpd_avx512f(auVar64,auVar62);
      auVar64 = vmulpd_avx512f(local_2280,local_1f40);
      auVar71 = vmulpd_avx512f(auVar63,local_1a80);
      local_840 = vaddpd_avx512f(auVar69,auVar65);
      local_e40 = vaddpd_avx512f(auVar62,auVar64);
      auVar62 = vmulpd_avx512f(local_2940,local_2000);
      auVar64 = vmulpd_avx512f(local_2940,local_1d00);
      auVar65 = vmulpd_avx512f(local_2940,local_1a00);
      auVar62 = vaddpd_avx512f(auVar78,auVar62);
      auVar69 = vmulpd_avx512f(local_22c0,local_1f00);
      auVar64 = vaddpd_avx512f(auVar72,auVar64);
      auVar65 = vaddpd_avx512f(auVar73,auVar65);
      local_b00 = vaddpd_avx512f(auVar64,auVar68);
      local_800 = vaddpd_avx512f(auVar65,auVar70);
      local_e00 = vaddpd_avx512f(auVar62,auVar69);
      auVar62 = vmulpd_avx512f(local_21c0,local_1fc0);
      auVar64 = vmulpd_avx512f(local_21c0,local_19c0);
      auVar65 = vmulpd_avx512f(local_21c0,local_1cc0);
      auVar62 = vaddpd_avx512f(auVar67,auVar62);
      auVar65 = vaddpd_avx512f(auVar74,auVar65);
      auVar67 = vmulpd_avx512f(local_2300,local_1ec0);
      auVar68 = vmulpd_avx512f(local_2300,local_1bc0);
      auVar64 = vaddpd_avx512f(auVar66,auVar64);
      auVar66 = vmulpd_avx512f(local_2300,local_18c0);
      local_dc0 = vaddpd_avx512f(auVar62,auVar67);
      local_ac0 = vaddpd_avx512f(auVar65,auVar68);
      auVar62 = vmulpd_avx512f(local_2240,local_1980);
      auVar63 = vmulpd_avx512f(auVar63,local_2080);
      auVar65 = vmulpd_avx512f(local_2240,local_1f80);
      local_7c0 = vaddpd_avx512f(auVar64,auVar66);
      auVar64 = vmulpd_avx512f(local_2240,local_1c80);
      auVar64 = vaddpd_avx512f(auVar77,auVar64);
      auVar62 = vaddpd_avx512f(auVar71,auVar62);
      auVar63 = vaddpd_avx512f(auVar63,auVar65);
      auVar65 = vmulpd_avx512f(local_2340,local_1e80);
      auVar66 = vmulpd_avx512f(local_2340,local_1b80);
      auVar67 = vmulpd_avx512f(local_2340,local_1880);
      local_d80 = vaddpd_avx512f(auVar63,auVar65);
      local_a80 = vaddpd_avx512f(auVar64,auVar66);
      local_780 = vaddpd_avx512f(auVar62,auVar67);
      auVar62 = vmulpd_avx512f(local_2280,local_2040);
      auVar63 = vmulpd_avx512f(local_2600,local_2140);
      auVar64 = vmulpd_avx512f(local_2600,local_1e40);
      auVar62 = vaddpd_avx512f(auVar63,auVar62);
      auVar63 = vmulpd_avx512f(local_22c0,local_2000);
      auVar65 = vmulpd_avx512f(local_2880,local_1f40);
      local_d40 = vaddpd_avx512f(auVar62,auVar65);
      auVar62 = vmulpd_avx512f(local_2640,local_2100);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_2300,local_1fc0);
      auVar65 = vmulpd_avx512f(local_2900,local_1f00);
      local_d00 = vaddpd_avx512f(auVar62,auVar65);
      auVar62 = vmulpd_avx512f(local_2680,local_20c0);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_2340,local_1f80);
      auVar65 = vmulpd_avx512f(local_2180,local_1ec0);
      local_cc0 = vaddpd_avx512f(auVar62,auVar65);
      auVar62 = vmulpd_avx512f(local_26c0,local_2080);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_2280,local_1d40);
      auVar65 = vmulpd_avx512f(local_2200,local_1e80);
      local_c80 = vaddpd_avx512f(auVar62,auVar65);
      auVar62 = vmulpd_avx512f(local_2640,local_1e00);
      auVar63 = vaddpd_avx512f(auVar64,auVar63);
      auVar64 = vmulpd_avx512f(local_2880,local_1c40);
      auVar65 = vmulpd_avx512f(local_22c0,local_1d00);
      local_a40 = vaddpd_avx512f(auVar63,auVar64);
      auVar63 = vmulpd_avx512f(local_2680,local_1dc0);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar64 = vmulpd_avx512f(local_2900,local_1c00);
      auVar65 = vmulpd_avx512f(local_2300,local_1cc0);
      local_a00 = vaddpd_avx512f(auVar62,auVar64);
      auVar62 = vmulpd_avx512f(local_26c0,local_1d80);
      auVar63 = vaddpd_avx512f(auVar63,auVar65);
      auVar64 = vmulpd_avx512f(local_2180,local_1bc0);
      auVar65 = vmulpd_avx512f(local_2340,local_1c80);
      local_9c0 = vaddpd_avx512f(auVar63,auVar64);
      auVar63 = vmulpd_avx512f(local_2600,local_1b40);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar64 = vmulpd_avx512f(local_2200,local_1b80);
      auVar65 = vmulpd_avx512f(local_2280,local_1a40);
      local_980 = vaddpd_avx512f(auVar62,auVar64);
      auVar62 = vaddpd_avx512f(auVar63,auVar65);
      auVar63 = vmulpd_avx512f(local_2880,local_1940);
      auVar64 = vmulpd_avx512f(local_2640,local_1b00);
      auVar65 = vmulpd_avx512f(local_22c0,local_1a00);
      local_740 = vaddpd_avx512f(auVar62,auVar63);
      auVar62 = vaddpd_avx512f(auVar64,auVar65);
      auVar63 = vmulpd_avx512f(local_2900,local_1900);
      auVar64 = vmulpd_avx512f(local_2680,local_1ac0);
      auVar65 = vmulpd_avx512f(local_2300,local_19c0);
      local_700 = vaddpd_avx512f(auVar62,auVar63);
      auVar62 = vmulpd_avx512f(local_26c0,local_1a80);
      auVar63 = vaddpd_avx512f(auVar64,auVar65);
      auVar64 = vmulpd_avx512f(local_2180,local_18c0);
      auVar65 = vmulpd_avx512f(local_2340,local_1980);
      local_6c0 = vaddpd_avx512f(auVar63,auVar64);
      auVar62 = vaddpd_avx512f(auVar62,auVar65);
      auVar63 = vmulpd_avx512f(local_2200,local_1880);
      local_680 = vaddpd_avx512f(auVar62,auVar63);
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows < 0x10) ||
         (lVar47 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar47 < local_3190)) goto LAB_0076b1d7;
      local_31f0._0_8_ =
           (long)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data + local_31f8;
      local_31e0 = local_31b0;
      local_31d8.m_value = 0;
      local_31d0.m_value = local_31a0;
      local_3240 = 1.0;
      local_31c8 = lVar47;
      local_31c0 = (Matrix<double,_96,_3,_0,_96,_3> *)local_f40;
      Eigen::internal::
      generic_product_impl<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>,Eigen::Matrix<double,96,3,0,96,3>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,16,3,1,16,3>>
                (&local_500,
                 (Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false> *)local_31f0,
                 (Matrix<double,_96,_3,_0,_96,_3> *)local_f40,&local_3240);
      local_31b8 = local_31b8 + 0x20;
      local_31f8 = lVar46 + 0x300;
      uVar58 = uVar58 + 1;
    } while (uVar58 < (ulong)(long)this->m_numLayers);
  }
  pCVar54 = local_31a8;
  pdVar57 = (local_31a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  if ((local_31a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      != 0x30) {
    if (pdVar57 != (double *)0x0) {
      free((void *)pdVar57[-1]);
    }
    pvVar55 = malloc(0x1c0);
    if (pvVar55 == (void *)0x0) {
      puVar56 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar56 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar56,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar55 & 0xffffffffffffffc0) + 0x38) = pvVar55;
    pdVar57 = (double *)(((ulong)pvVar55 & 0xffffffffffffffc0) + 0x40);
    (pCVar54->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar57;
    (pCVar54->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
         0x30;
  }
  uVar58 = 0xfffffffffffffff8;
  do {
    dVar3 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
            m_data.array[uVar58 + 9];
    dVar48 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
             m_data.array[uVar58 + 10];
    dVar49 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
             m_data.array[uVar58 + 0xb];
    dVar50 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
             m_data.array[uVar58 + 0xc];
    dVar51 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
             m_data.array[uVar58 + 0xd];
    dVar52 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
             m_data.array[uVar58 + 0xe];
    dVar53 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
             m_data.array[uVar58 + 0xf];
    pdVar2 = pdVar57 + uVar58 + 8;
    *pdVar2 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
              m_data.array[uVar58 + 8];
    pdVar2[1] = dVar3;
    pdVar2[2] = dVar48;
    pdVar2[3] = dVar49;
    pdVar2[4] = dVar50;
    pdVar2[5] = dVar51;
    pdVar2[6] = dVar52;
    pdVar2[7] = dVar53;
    uVar58 = uVar58 + 8;
  } while (uVar58 < 0x28);
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.  Note that the integrand for the generalize internal force vector for a straight and normalized element
    // is of order : 12 in xi, 12 in eta, and 4 in zeta. This requires GQ 7 points along the xi and eta directions and 3
    // points along the zeta direction for "Full Integration". However, very similar results can be obtained with fewer
    // GQ point in each direction, resulting in significantly fewer calculations.  Based on testing, this could be as
    // low as 4x4x2 or 3x3x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    MatrixNx3 QiCompact;
    QiCompact.setZero();

    // Loop over all of the layers summing the contribution to the generalized internal force vector from each layer
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
        // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
        // The entries are grouped by component in block matrices (column vectors)
        // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
        //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
        //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
        //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> P_Block;

        P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

        P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

        P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

        // =============================================================================
        // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix for the current
        // layer to get the generalized force vector in matrix form (in the correct order if its calculated in row-major
        // memory layout)
        // =============================================================================

        QiCompact.noalias() += m_SD.block<NSF, 3 * NIP>(0, 3 * kl * NIP) * P_Block;
    }

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}